

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  uint uVar1;
  pointer *ppMVar2;
  double dVar3;
  pointer pMVar4;
  pointer pFVar5;
  double *pdVar6;
  double *pdVar7;
  iterator __position;
  undefined1 auVar8 [16];
  undefined8 *puVar9;
  double *pdVar10;
  long lVar11;
  Index IVar12;
  ulong uVar13;
  long lVar14;
  undefined4 in_register_00000034;
  double *pdVar15;
  long lVar16;
  long lVar17;
  Index col_1;
  ulong uVar18;
  Index col;
  int iVar19;
  long lVar20;
  long lVar21;
  double dVar22;
  Mat p;
  Mat sol;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  DenseStorage<double,__1,__1,__1,_0> local_c8;
  Mat *local_a8;
  plain_array<double,_1,_0,_0> local_a0;
  Mat *local_98;
  undefined8 uStack_90;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_88;
  long local_70;
  double *local_68;
  double *local_60;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  local_58;
  
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  local_e8.m_cols = 0;
  lVar17 = (long)this->M;
  lVar11 = (long)this->nSolFound;
  if ((lVar11 != 0 && lVar17 != 0) &&
     (auVar8 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar8 / SEXT816(lVar11),0) < lVar17)) {
    puVar9 = (undefined8 *)
             __cxa_allocate_exception
                       (8,CONCAT44(in_register_00000034,newSol1),SUB168(auVar8 % SEXT816(lVar11),0))
    ;
    *puVar9 = operator_delete;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,lVar11 * lVar17,lVar17,lVar11);
  local_c8.m_data = (double *)0x0;
  local_c8.m_rows = 0;
  local_c8.m_cols = 0;
  lVar11 = (long)this->nSolFound;
  if ((lVar11 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar11),0) < 1)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = operator_delete;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c8,lVar11,1,lVar11);
  uVar1 = this->nSolFound - 1;
  if (1 < this->nSolFound) {
    pMVar4 = (this->predictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar18 = 0;
    pdVar15 = local_c8.m_data;
    do {
      if (0 < local_c8.m_rows) {
        lVar11 = 0;
        do {
          pdVar15[lVar11] =
               (double)pMVar4[uVar18].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                       m_storage;
          lVar11 = lVar11 + 1;
        } while (local_c8.m_rows != lVar11);
      }
      uVar18 = uVar18 + 1;
      pdVar15 = pdVar15 + local_c8.m_rows;
    } while (uVar18 != uVar1);
  }
  pFVar5 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < local_c8.m_rows) {
    lVar11 = 0;
    do {
      local_c8.m_data[worseSol * local_c8.m_rows + lVar11] =
           (double)pFVar5[newSol1].super_LinearExpert<1,_1>.pred_x.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
      lVar11 = lVar11 + 1;
    } while (local_c8.m_rows != lVar11);
  }
  if (0 < local_c8.m_rows) {
    lVar11 = 0;
    do {
      local_c8.m_data[(int)uVar1 * local_c8.m_rows + lVar11] =
           (double)pFVar5[newSol2].super_LinearExpert<1,_1>.pred_x.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
      lVar11 = lVar11 + 1;
    } while (local_c8.m_rows != lVar11);
  }
  if (0 < (this->param).iterMax) {
    local_98 = &this->invRxj;
    local_a8 = &this->fInvRj;
    iVar19 = 0;
    do {
      if (0 < this->M) {
        lVar11 = 0;
        lVar17 = 0;
        do {
          if (0 < this->nSolFound) {
            lVar21 = 0;
            do {
              dVar22 = (double)(this->experts).
                               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               .
                               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar17].
                               super_LinearExpert<1,_1>.pred_x.
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                               m_storage - local_c8.m_data[local_c8.m_rows * lVar21];
              dVar22 = exp((this->fInvRj).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data
                           [(this->fInvRj).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows * lVar17] * dVar22 * dVar22 * -0.5);
              local_e8.m_data[local_e8.m_rows * lVar21 + lVar17] = dVar22;
              lVar21 = lVar21 + 1;
            } while (lVar21 < this->nSolFound);
          }
          if (local_e8.m_cols == 0) {
            dVar22 = 0.0;
          }
          else {
            dVar22 = local_e8.m_data[lVar17];
            if (1 < local_e8.m_cols) {
              lVar21 = local_e8.m_cols + -1;
              pdVar15 = (double *)(local_e8.m_rows * 8 + lVar11 + (long)local_e8.m_data);
              do {
                dVar22 = dVar22 + *pdVar15;
                pdVar15 = pdVar15 + local_e8.m_rows;
                lVar21 = lVar21 + -1;
              } while (lVar21 != 0);
            }
          }
          if ((0.0 < dVar22) && (0 < local_e8.m_cols)) {
            pdVar15 = (double *)((long)local_e8.m_data + lVar11);
            IVar12 = local_e8.m_cols;
            do {
              *pdVar15 = *pdVar15 / dVar22;
              pdVar15 = pdVar15 + local_e8.m_rows;
              IVar12 = IVar12 + -1;
            } while (IVar12 != 0);
          }
          lVar17 = lVar17 + 1;
          lVar11 = lVar11 + 8;
        } while (lVar17 < this->M);
      }
      local_58.m_lhs.m_lhs = local_98;
      local_58.m_rhs.m_lhs = local_a8;
      local_58.m_lhs.m_rhs = (RhsNested)&local_e8;
      local_58.m_rhs.m_rhs = (RhsNested)&local_e8;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_c8,&local_58,
                 (assign_op<double,_double> *)&local_88);
      iVar19 = iVar19 + 1;
    } while (iVar19 < (this->param).iterMax);
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            *)&local_58,(long)this->nSolFound,&this->zeroX,(allocator_type *)&local_88);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_88,(long)this->nSolFound,&this->zeroX,(allocator_type *)&local_a0);
  iVar19 = this->nSolFound;
  lVar11 = (long)iVar19;
  if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != lVar11) {
    free((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    if (iVar19 < 1) {
      pdVar15 = (double *)0x0;
    }
    else {
      pdVar15 = (double *)malloc(lVar11 * 8);
      if (pdVar15 == (double *)0x0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = operator_delete;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar15;
  }
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar11;
  if (0 < iVar19) {
    memset((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data,0,lVar11 * 8);
  }
  if (0 < this->M) {
    pFVar5 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = (Mat *)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    pdVar6 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    local_60 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    lVar17 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    pdVar7 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    lVar21 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar14 = 0;
    local_68 = local_e8.m_data;
    pdVar15 = local_e8.m_data + local_e8.m_rows;
    do {
      iVar19 = -(uint)(local_e8.m_cols == 0);
      if (1 < local_e8.m_cols) {
        dVar22 = local_e8.m_data[lVar14];
        lVar16 = 1;
        lVar20 = 0;
        pdVar10 = pdVar15;
        do {
          dVar3 = *pdVar10;
          if (dVar22 < dVar3) {
            lVar20 = lVar16;
          }
          iVar19 = (int)lVar20;
          if (dVar3 <= dVar22) {
            dVar3 = dVar22;
          }
          dVar22 = dVar3;
          lVar16 = lVar16 + 1;
          pdVar10 = pdVar10 + local_e8.m_rows;
        } while (local_e8.m_cols != lVar16);
      }
      *(int *)((long)&(local_a8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + lVar14 * 4) = iVar19;
      pdVar6[iVar19] = pFVar5[lVar14].super_LinearExpert<1,_1>.p_z_T + pdVar6[iVar19];
      (&((local_58.m_lhs.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_data)[iVar19] =
           (double *)
           (local_60[lVar17 * lVar14] +
           (double)(&((local_58.m_lhs.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data)[iVar19]);
      local_88.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar19].
      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
           pdVar7[lVar21 * lVar14] +
           local_88.
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar19].
           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
      lVar14 = lVar14 + 1;
      pdVar15 = pdVar15 + 1;
    } while (lVar14 < this->M);
  }
  local_98 = (Mat *)this->pNoiseModelZ;
  uStack_90 = 0;
  pdVar15 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  local_70 = lVar11;
  if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar11,1
              );
  }
  pdVar6 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar18 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar13 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar18) {
    lVar11 = 0;
    do {
      pdVar7 = pdVar15 + lVar11;
      dVar22 = pdVar7[1];
      pdVar10 = pdVar6 + lVar11;
      *pdVar10 = *pdVar7 + (double)local_98;
      pdVar10[1] = dVar22 + (double)local_98;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar18) {
    do {
      pdVar6[uVar13] = pdVar15[uVar13] + (double)local_98;
      uVar13 = uVar13 + 1;
    } while (uVar18 != uVar13);
  }
  pMVar4 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar4) {
    (this->predictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  if (0 < this->nSolFound) {
    lVar11 = 0;
    do {
      local_a0.array[0] =
           (double  [1])
           (local_88.
            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar11].
            super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] /
           (double)(&((local_58.m_lhs.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data)[lVar11]);
      __position._M_current =
           (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->predictions).
          super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::_M_realloc_insert(&(this->predictions).
                             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ,__position,(value_type *)&local_a0);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
        m_storage.m_data.array[0] = (double)local_a0.array[0];
        ppMVar2 = &(this->predictions).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->nSolFound);
  }
  if (local_88.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_88.
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.m_lhs.m_lhs != (Mat *)0x0) {
    free(local_58.m_lhs.m_lhs);
  }
  free(local_c8.m_data);
  free(local_e8.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterForwardSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nSolFound);
    Mat sol(D,nSolFound);

    // "Educated" guesses for the nSolFound solutions
    for(int k = 0; k < nSolFound-1; k++)
        sol.col(k) = predictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredX();
    sol.col(nSolFound-1) = experts[newSol2].getPredX();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nSolFound; k++ )
            {
                X dist = experts[j].getPredX() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(fInvRj.col(j).asDiagonal()*dist));
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;
        }
        // M-Step
        sol = (invRxj * p).cwiseQuotient( fInvRj * p );
        /* Here I can easily implement k-means by hard assigning to most probable solution */
    }


    /***** Recalculate (hard-assign) solutions   ******/
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    sum_p_z.setZero(nSolFound);

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
    {
        p.row(j).maxCoeff(&sNearest[j]);

        sum_p_z(sNearest[j]) += experts[j].get_p_z();
        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }
    sumW = sum_p_z.array() + pNoiseModelZ;

    // Clear predict data structure
    predictions.clear();

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
        predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
}